

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

int ixmlNode_isAncestor(IXML_Node *ancestorNode,IXML_Node *toFind)

{
  Nodeptr p_Var1;
  int iVar2;
  
  iVar2 = 0;
  if (ancestorNode != (IXML_Node *)0x0) {
    p_Var1 = toFind->parentNode;
    while (p_Var1 != ancestorNode) {
      iVar2 = ixmlNode_isAncestor(ancestorNode->firstChild,toFind);
      if (iVar2 != 0) {
        return iVar2;
      }
      ancestorNode = ancestorNode->nextSibling;
      if (ancestorNode == (Nodeptr)0x0) {
        return 0;
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int ixmlNode_isAncestor(
	/*! [in] The candidate to ancestor \b Node. */
	IXML_Node *ancestorNode,
	/*! [in] The \b Node to check for an ancestor. */
	IXML_Node *toFind)
{
	int found = 0;

	if (ancestorNode != NULL && toFind != NULL) {
		if (toFind->parentNode == ancestorNode) {
			return 1;
		} else {
			found = ixmlNode_isAncestor(
				ancestorNode->firstChild, toFind);
			if (found == 0) {
				found = ixmlNode_isAncestor(
					ancestorNode->nextSibling, toFind);
			}
		}
	}

	return found;
}